

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

_Bool parse_view_box(element_t *element,int id,plutovg_rect_t *view_box)

{
  _Bool _Var1;
  string_t *psVar2;
  undefined4 in_register_00000034;
  float *pfVar3;
  char *end;
  char *it;
  float h;
  float w;
  float y;
  float x;
  
  pfVar3 = (float *)CONCAT44(in_register_00000034,id);
  psVar2 = find_attribute(element,0x27,false);
  if (psVar2 != (string_t *)0x0) {
    it = psVar2->data;
    end = it + psVar2->length;
    _Var1 = parse_float(&it,end,&x);
    if (((((_Var1) && (_Var1 = skip_ws_comma(&it,end), _Var1)) &&
         (_Var1 = parse_float(&it,end,&y), _Var1)) &&
        ((_Var1 = skip_ws_comma(&it,end), _Var1 && (_Var1 = parse_float(&it,end,&w), _Var1)))) &&
       ((_Var1 = skip_ws_comma(&it,end), _Var1 &&
        ((_Var1 = parse_float(&it,end,&h), _Var1 && (_Var1 = skip_ws(&it,end), !_Var1)))))) {
      if (w <= 0.0) {
        return false;
      }
      if (0.0 < h) {
        *pfVar3 = x;
        pfVar3[1] = y;
        pfVar3[2] = w;
        pfVar3[3] = h;
        return true;
      }
      return false;
    }
  }
  return false;
}

Assistant:

static bool parse_view_box(const element_t* element, int id, plutovg_rect_t* view_box)
{
    const string_t* value = find_attribute(element, id, false);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;

    float x, y, w, h;
    if(!parse_float(&it, end, &x)
        || !skip_ws_comma(&it, end)
        || !parse_float(&it, end, &y)
        || !skip_ws_comma(&it, end)
        || !parse_float(&it, end, &w)
        || !skip_ws_comma(&it, end)
        || !parse_float(&it, end, &h)
        || skip_ws(&it, end)) {
        return false;
    }

    if(w <= 0.f || h <= 0.f)
        return false;
    view_box->x = x;
    view_box->y = y;
    view_box->w = w;
    view_box->h = h;
    return true;
}